

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  Walker w;
  Walker local_40;
  
  local_40.eCode = 1;
  local_40.xExprCallback = exprNodeIsConstant;
  local_40.xSelectCallback = sqlite3SelectWalkFail;
  local_40.u.n = 0;
  if (pExpr != (Expr *)0x0) {
    walkExpr(&local_40,pExpr);
  }
  if (local_40.eCode == 0) {
    if (1 < pParse->eParseMode) {
      sqlite3RenameExprUnmap(pParse,pExpr);
    }
    if (pExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pExpr);
    }
    pExpr = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (pExpr != (Expr *)0x0) {
      pExpr->op = '\0';
      pExpr->affExpr = '\0';
      pExpr->op2 = '\0';
      pExpr->field_0x3 = 0;
      pExpr->flags = 0;
      (pExpr->u).zToken = (char *)0x0;
      pExpr->iColumn = 0;
      pExpr->iAgg = 0;
      pExpr->w = (anon_union_4_2_009eaf8f_for_w)0x0;
      pExpr->pAggInfo = (AggInfo *)0x0;
      (pExpr->x).pList = (ExprList *)0x0;
      pExpr->nHeight = 0;
      pExpr->iTable = 0;
      pExpr->pLeft = (Expr *)0x0;
      pExpr->pRight = (Expr *)0x0;
      (pExpr->y).pTab = (Table *)0x0;
      pExpr->op = 'y';
      pExpr->iAgg = -1;
      pExpr->nHeight = 1;
    }
  }
  return pExpr;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}